

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O2

bool duckdb::StringUtil::IsLower(string *str)

{
  __type _Var1;
  string local_30;
  
  Lower(&local_30,str);
  _Var1 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)str
                            ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return _Var1;
}

Assistant:

bool StringUtil::IsLower(const string &str) {
	return str == Lower(str);
}